

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O3

char * fruitname(boolean juice)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  
  iVar1 = nextobuf_bufidx + 1 >> 0x1f;
  nextobuf_bufidx =
       nextobuf_bufidx + (((uint)((nextobuf_bufidx + 1) / 6 + iVar1) >> 1) - iVar1) * -0xc + 1;
  lVar2 = (long)nextobuf_bufidx;
  pcVar3 = strstri(pl_fruit," of ");
  pcVar4 = pcVar3 + 4;
  if (pcVar3 == (char *)0x0) {
    pcVar4 = pl_fruit;
  }
  pcVar4 = makesingular(pcVar4);
  pcVar3 = " juice";
  if (juice == '\0') {
    pcVar3 = "";
  }
  sprintf(nextobuf_bufs + lVar2 * 0x100,"%s%s",pcVar4,pcVar3);
  return nextobuf_bufs + lVar2 * 0x100;
}

Assistant:

char *fruitname(boolean juice)
{
    char *buf = nextobuf();
    const char *fruit_nam = strstri(pl_fruit, " of ");

    if (fruit_nam)
	fruit_nam += 4;		/* skip past " of " */
    else
	fruit_nam = pl_fruit;	/* use it as is */

    sprintf(buf, "%s%s", makesingular(fruit_nam), juice ? " juice" : "");
    return buf;
}